

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_vlog(ly_ctx *ctx,LY_ECODE ecode,LY_VLOG_ELEM elem_type,void *elem,...)

{
  char in_AL;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ly_err_item *local_50;
  ly_err_item *first;
  char *path;
  char *fmt;
  va_list ap;
  void *elem_local;
  LY_VLOG_ELEM elem_type_local;
  LY_ECODE ecode_local;
  ly_ctx *ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  first = (ly_err_item *)0x0;
  if ((ecode != LYE_PATH) || (path_flag != 0)) {
    local_e8 = in_R8;
    local_e0 = in_R9;
    ap[0].reg_save_area = elem;
    if ((path_flag != 0) && (elem_type != LY_VLOG_NONE)) {
      if (elem_type == LY_VLOG_PREV) {
        local_50 = ly_err_first(ctx);
        if ((local_50 != (ly_err_item *)0x0) && (local_50->prev->path != (char *)0x0)) {
          first = (ly_err_item *)strdup(local_50->prev->path);
        }
      }
      else if (elem == (void *)0x0) {
        first = (ly_err_item *)strdup("/");
      }
      else {
        ly_vlog_build_path(elem_type,elem,(char **)&first,0,0);
      }
    }
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    fmt._4_4_ = 0x30;
    fmt._0_4_ = 0x20;
    if (ecode == LYE_PATH) {
      if (first == (ly_err_item *)0x0) {
        __assert_fail("path",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                      ,0x371,
                      "void ly_vlog(const struct ly_ctx *, LY_ECODE, enum LY_VLOG_ELEM, const void *, ...)"
                     );
      }
      log_vprintf(ctx,LY_LLERR,LY_EVALID,LYVE_SUCCESS,(char *)first,(char *)0x0,
                  (__va_list_tag *)&fmt);
    }
    else if (ecode == LYE_SPEC) {
      fmt._4_4_ = 0x30;
      fmt._0_4_ = 0x28;
      path = local_e8;
      log_vprintf(ctx,LY_LLERR,LY_EVALID,LYVE_SUCCESS,(char *)first,local_e8,(__va_list_tag *)&fmt);
    }
    else {
      log_vprintf(ctx,LY_LLERR,LY_EVALID,ecode2vecode[ecode],(char *)first,ly_errs[ecode],
                  (__va_list_tag *)&fmt);
    }
  }
  return;
}

Assistant:

void
ly_vlog(const struct ly_ctx *ctx, LY_ECODE ecode, enum LY_VLOG_ELEM elem_type, const void *elem, ...)
{
    va_list ap;
    const char *fmt;
    char* path = NULL;
    const struct ly_err_item *first;

    if ((ecode == LYE_PATH) && !path_flag) {
        return;
    }

    if (path_flag && (elem_type != LY_VLOG_NONE)) {
        if (elem_type == LY_VLOG_PREV) {
            /* use previous path */
            first = ly_err_first(ctx);
            if (first && first->prev->path) {
                path = strdup(first->prev->path);
            }
        } else {
            /* print path */
            if (!elem) {
                /* top-level */
                path = strdup("/");
            } else {
                ly_vlog_build_path(elem_type, elem, &path, 0, 0);
            }
        }
    }

    va_start(ap, elem);
    /* path is spent and should not be freed! */
    switch (ecode) {
    case LYE_SPEC:
        fmt = va_arg(ap, char *);
        log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, fmt, ap);
        break;
    case LYE_PATH:
        assert(path);
        log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, NULL, ap);
        break;
    default:
        log_vprintf(ctx, LY_LLERR, LY_EVALID, ecode2vecode[ecode], path, ly_errs[ecode], ap);
        break;
    }
    va_end(ap);
}